

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

any __thiscall
cs_impl::
cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
::call(cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  vector *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start == 8) {
    _call<0>(&local_c0,
             (cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
              *)args,in_RDX,(sequence<0> *)&cov::make_sequence<0,0>::result);
    any::make_constant<std::__cxx11::string,std::__cxx11::string_const&>((any *)this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_60,1);
  std::operator+(&local_40,"Wrong size of the arguments. Expected ",&local_60);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_a0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar2) {
    local_a0.field_2._M_allocated_capacity = *psVar2;
    local_a0.field_2._8_8_ = plVar1[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar2;
  }
  local_a0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string
            (&local_80,
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_c0,&local_a0,&local_80);
  cs::runtime_error::runtime_error(this_00,&local_c0);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}